

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O3

Vec_Int_t * Acb_ObjMarkTfo(Acb_Ntk_t *p,Vec_Int_t *vDivs,int Pivot,int nTfoLevMax,int nFanMax)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  uint uVar3;
  long lVar4;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(4000);
  p_00->pArray = piVar2;
  uVar3 = (p->vObjTrav).nSize;
  if ((int)uVar3 < 1) {
    uVar3 = (p->vObjType).nCap;
    if ((p->vObjTrav).nCap < (int)uVar3) {
      piVar2 = (p->vObjTrav).pArray;
      if (piVar2 == (int *)0x0) {
        piVar2 = (int *)malloc((long)(int)uVar3 << 2);
      }
      else {
        piVar2 = (int *)realloc(piVar2,(long)(int)uVar3 << 2);
      }
      (p->vObjTrav).pArray = piVar2;
      if (piVar2 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x215,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vObjTrav).nCap = uVar3;
    }
    if (0 < (int)uVar3) {
      memset((p->vObjTrav).pArray,0,(ulong)uVar3 * 4);
    }
    (p->vObjTrav).nSize = uVar3;
  }
  iVar1 = p->nObjTravs + 1;
  p->nObjTravs = iVar1;
  if ((-1 < Pivot) && (Pivot < (int)uVar3)) {
    (p->vObjTrav).pArray[(uint)Pivot] = iVar1;
    Vec_IntPush(p_00,Pivot);
    if (0 < vDivs->nSize) {
      lVar4 = 0;
      do {
        Acb_ObjMarkTfo_rec(p,vDivs->pArray[lVar4],nTfoLevMax,nFanMax,p_00);
        lVar4 = lVar4 + 1;
      } while (lVar4 < vDivs->nSize);
    }
    return p_00;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Vec_Int_t * Acb_ObjMarkTfo( Acb_Ntk_t * p, Vec_Int_t * vDivs, int Pivot, int nTfoLevMax, int nFanMax )
{
    Vec_Int_t * vMarked = Vec_IntAlloc( 1000 );
    int i, iObj;
    Acb_NtkIncTravId( p );
    Acb_ObjSetTravIdCur( p, Pivot );
    Vec_IntPush( vMarked, Pivot );
    Vec_IntForEachEntry( vDivs, iObj, i )
        Acb_ObjMarkTfo_rec( p, iObj, nTfoLevMax, nFanMax, vMarked );
    return vMarked;
}